

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

void __thiscall
GrcErrorList::AddItem
          (GrcErrorList *this,bool fFatal,int nID,GdlObject *pgdlObj,GrpLineAndFile *plnf,
          string *staMsg)

{
  GrcErrorItem *this_00;
  GrcErrorItem *perr;
  string local_98;
  string local_78 [32];
  GrpLineAndFile lnf;
  
  std::__cxx11::string::string(local_78,"",(allocator *)&perr);
  lnf.m_nLinePre = 0;
  lnf.m_nLineOrig = 0;
  std::__cxx11::string::string((string *)&lnf.m_staFile,local_78);
  std::__cxx11::string::~string(local_78);
  if ((plnf != (GrpLineAndFile *)0x0) || (plnf = &pgdlObj->m_lnf, pgdlObj != (GdlObject *)0x0)) {
    GrpLineAndFile::operator=(&lnf,plnf);
  }
  this_00 = (GrcErrorItem *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_98,(string *)staMsg);
  GrcErrorItem::GrcErrorItem(this_00,fFatal,nID,&lnf,&local_98,pgdlObj);
  std::__cxx11::string::~string((string *)&local_98);
  perr = this_00;
  std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::push_back(&this->m_vperr,&perr);
  if (fFatal) {
    this->m_fFatalError = true;
  }
  std::__cxx11::string::~string((string *)&lnf.m_staFile);
  return;
}

Assistant:

void GrcErrorList::AddItem(bool fFatal, int nID, GdlObject * pgdlObj, const GrpLineAndFile * plnf,
	std::string staMsg)
{
	GrpLineAndFile lnf(0, 0, "");
	if (plnf == NULL)
	{
		if (pgdlObj)
			lnf = pgdlObj->LineAndFile();
	}
	else
		lnf = *plnf;
	
	GrcErrorItem * perr = new GrcErrorItem(fFatal, nID, lnf, staMsg, pgdlObj);
	m_vperr.push_back(perr);

	if (fFatal)
		m_fFatalError = true;
}